

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int m_split_fs(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  uint32_t uVar3;
  uint uVar4;
  aec_stream_conflict *in_RDI;
  int k;
  internal_state_conflict *state;
  aec_stream_conflict *in_stack_ffffffffffffffd8;
  
  piVar2 = in_RDI->state;
  iVar1 = piVar2->id;
  do {
    uVar3 = fs_ask(in_stack_ffffffffffffffd8);
    if (uVar3 == 0) {
      return 0;
    }
    piVar2->rsip[piVar2->sample_counter] = piVar2->fs << ((char)iVar1 - 1U & 0x1f);
    fs_drop(in_RDI);
    uVar4 = piVar2->sample_counter + 1;
    piVar2->sample_counter = uVar4;
  } while (uVar4 < piVar2->encoded_block_size);
  piVar2->sample_counter = 0;
  piVar2->mode = m_split_output;
  return 1;
}

Assistant:

static int m_split_fs(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (fs_ask(strm) == 0)
            return M_EXIT;
        state->rsip[state->sample_counter] = state->fs << k;
        fs_drop(strm);
    } while(++state->sample_counter < state->encoded_block_size);

    state->sample_counter = 0;
    state->mode = m_split_output;

    return M_CONTINUE;
}